

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeString::extractBetween
          (UnicodeString *this,int32_t start,int32_t limit,UnicodeString *target)

{
  int32_t local_28;
  int32_t local_24;
  
  local_28 = limit;
  local_24 = start;
  pinIndex(this,&local_24);
  pinIndex(this,&local_28);
  doExtract(this,local_24,local_28 - local_24,target);
  return;
}

Assistant:

void 
UnicodeString::extractBetween(int32_t start,
                  int32_t limit,
                  UnicodeString& target) const {
  pinIndex(start);
  pinIndex(limit);
  doExtract(start, limit - start, target);
}